

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat __thiscall Mat::GetCol(Mat *this,int iCol)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  double *extraout_RDX;
  double *pdVar3;
  undefined4 in_register_00000034;
  int *piVar4;
  double *pdVar5;
  long lVar6;
  Mat MVar7;
  
  piVar4 = (int *)CONCAT44(in_register_00000034,iCol);
  Mat(this,*piVar4);
  iVar1 = *piVar4;
  pdVar3 = extraout_RDX;
  if (0 < (long)iVar1) {
    iVar2 = piVar4[1];
    pdVar3 = this->v_;
    pdVar5 = (double *)((long)in_EDX * 8 + *(long *)(piVar4 + 2));
    lVar6 = 0;
    do {
      pdVar3[lVar6] = *pdVar5;
      lVar6 = lVar6 + 1;
      pdVar5 = pdVar5 + iVar2;
    } while (iVar1 != lVar6);
  }
  MVar7.v_ = pdVar3;
  MVar7._0_8_ = this;
  return MVar7;
}

Assistant:

Mat Mat::GetCol(int iCol)
{
	Mat Col(n_rows_);
	for ( int i = 0;  i< n_rows_; i++)
		Col.v_[i] = v_[n_cols_ * i+iCol];
	return Col;
}